

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits.cpp
# Opt level: O1

BIP9Stats * __thiscall
AbstractThresholdConditionChecker::GetStateStatisticsFor
          (BIP9Stats *__return_storage_ptr__,AbstractThresholdConditionChecker *this,
          CBlockIndex *pindex,Params *params,vector<bool,_std::allocator<bool>_> *signalling_blocks)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t __n;
  long lVar6;
  int iVar7;
  long in_FS_OFFSET;
  reference rVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->period = 0;
  __return_storage_ptr__->threshold = 0;
  __return_storage_ptr__->elapsed = 0;
  __return_storage_ptr__->count = 0;
  *(undefined4 *)&__return_storage_ptr__->possible = 0;
  iVar2 = (*this->_vptr_AbstractThresholdConditionChecker[4])(this,params);
  __return_storage_ptr__->period = iVar2;
  iVar3 = (*this->_vptr_AbstractThresholdConditionChecker[5])(this,params);
  __return_storage_ptr__->threshold = iVar3;
  if (pindex != (CBlockIndex *)0x0) {
    __n = (size_t)(pindex->nHeight % iVar2 + 1);
    if (signalling_blocks != (vector<bool,_std::allocator<bool>_> *)0x0) {
      std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(signalling_blocks,__n,false);
    }
    lVar6 = __n + 1;
    iVar5 = 0;
    iVar7 = 0;
    do {
      iVar4 = (**this->_vptr_AbstractThresholdConditionChecker)(this,pindex,params);
      if ((char)iVar4 != '\0') {
        iVar7 = iVar7 + 1;
        if (signalling_blocks != (vector<bool,_std::allocator<bool>_> *)0x0) {
          rVar8 = std::vector<bool,_std::allocator<bool>_>::at(signalling_blocks,lVar6 - 2);
          *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
        }
      }
      pindex = pindex->pprev;
      lVar6 = lVar6 + -1;
      iVar5 = iVar5 + -1;
    } while (1 < lVar6);
    __return_storage_ptr__->elapsed = -iVar5;
    __return_storage_ptr__->count = iVar7;
    __return_storage_ptr__->possible =
         SBORROW4(iVar2 - iVar3,-(iVar7 + iVar5)) == (iVar2 - iVar3) + iVar7 + iVar5 < 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

BIP9Stats AbstractThresholdConditionChecker::GetStateStatisticsFor(const CBlockIndex* pindex, const Consensus::Params& params, std::vector<bool>* signalling_blocks) const
{
    BIP9Stats stats = {};

    stats.period = Period(params);
    stats.threshold = Threshold(params);

    if (pindex == nullptr) return stats;

    // Find how many blocks are in the current period
    int blocks_in_period = 1 + (pindex->nHeight % stats.period);

    // Reset signalling_blocks
    if (signalling_blocks) {
        signalling_blocks->assign(blocks_in_period, false);
    }

    // Count from current block to beginning of period
    int elapsed = 0;
    int count = 0;
    const CBlockIndex* currentIndex = pindex;
    do {
        ++elapsed;
        --blocks_in_period;
        if (Condition(currentIndex, params)) {
            ++count;
            if (signalling_blocks) signalling_blocks->at(blocks_in_period) = true;
        }
        currentIndex = currentIndex->pprev;
    } while(blocks_in_period > 0);

    stats.elapsed = elapsed;
    stats.count = count;
    stats.possible = (stats.period - stats.threshold ) >= (stats.elapsed - count);

    return stats;
}